

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

void __thiscall
USBAnalyzerResults::GenerateExportFileBytes
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  undefined8 uVar1;
  undefined2 uVar2;
  byte bVar3;
  uint uVar4;
  ulonglong uVar5;
  ostream *poVar6;
  string local_348 [36];
  undefined4 local_324;
  Frame local_320 [40];
  ulong local_2f8;
  U64 fcnt;
  U64 num_frames;
  char time_str [128];
  Frame f;
  char local_248;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  DisplayBase display_base_local;
  char *file_local;
  USBAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar5 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  poVar6 = std::operator<<((ostream *)&trigger_sample,"Time [s],Byte");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Frame::Frame((Frame *)(time_str + 0x78));
  num_frames._0_1_ = 0;
  fcnt = AnalyzerResults::GetNumFrames();
  local_2f8 = 0;
  do {
    if (fcnt <= local_2f8) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,fcnt);
      local_324 = 0;
LAB_00153aed:
      Frame::~Frame((Frame *)(time_str + 0x78));
      std::ofstream::~ofstream(&trigger_sample);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)local_320);
    uVar2 = local_320._32_2_;
    uVar1 = local_320._16_8_;
    time_str[0x78] = (char)local_320[0];
    time_str[0x79] = (char)local_320[1];
    time_str[0x7a] = (char)local_320[2];
    time_str[0x7b] = (char)local_320[3];
    time_str[0x7c] = (char)local_320[4];
    time_str[0x7d] = (char)local_320[5];
    time_str[0x7e] = (char)local_320[6];
    time_str[0x7f] = (char)local_320[7];
    Frame::~Frame(local_320);
    bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_2f8);
    if ((bVar3 & 1) != 0) {
      local_324 = 1;
      goto LAB_00153aed;
    }
    local_248 = (char)uVar2;
    if (local_248 == '\v') {
      AnalyzerHelpers::GetTimeString(time_str._120_8_,uVar5,uVar4,(char *)&num_frames,0x80);
      poVar6 = std::operator<<((ostream *)&trigger_sample,(char *)&num_frames);
      poVar6 = std::operator<<(poVar6,",");
      int2str_sal_abi_cxx11_((U64)local_348,(DisplayBase)uVar1,display_base);
      poVar6 = std::operator<<(poVar6,local_348);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_348);
    }
    local_2f8 = local_2f8 + 1;
  } while( true );
}

Assistant:

void USBAnalyzerResults::GenerateExportFileBytes( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Byte" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // start of a new packet?
        if( f.mType == FT_Byte )
        {
            // make the time string
            AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

            // output byte and timestamp
            file_stream << time_str << "," << int2str_sal( f.mData1, display_base, 8 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}